

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_next_global(REF_NODE ref_node,REF_GLOB *global)

{
  uint uVar1;
  long lVar2;
  
  if (ref_node->n_unused < 1) {
    lVar2 = ref_node->new_n_global;
    if (lVar2 == -1) {
      lVar2 = (long)ref_node->n;
      ref_node->old_n_global = lVar2;
      ref_node->new_n_global = lVar2;
    }
    *global = lVar2;
    ref_node->new_n_global = ref_node->new_n_global + 1;
    return 0;
  }
  uVar1 = ref_node_pop_unused(ref_node,global);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x218,
           "ref_node_next_global",(ulong)uVar1,"grab an unused global from list");
  }
  return (uint)(uVar1 != 0);
}

Assistant:

REF_FCN REF_STATUS ref_node_next_global(REF_NODE ref_node, REF_GLOB *global) {
  if (0 < ref_node_n_unused(ref_node)) {
    RSS(ref_node_pop_unused(ref_node, global),
        "grab an unused global from list");
  } else {
    if (REF_EMPTY == ref_node->new_n_global)
      RSS(ref_node_initialize_n_global(ref_node, ref_node_n(ref_node)),
          "init with n");
    (*global) = ref_node->new_n_global;
    (ref_node->new_n_global)++;
  }

  return REF_SUCCESS;
}